

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

double add_regularization<sparse_parameters>
                 (vw *all,bfgs *b,float regularization,sparse_parameters *weights)

{
  bool bVar1;
  uint32_t uVar2;
  float *pfVar3;
  char *pcVar4;
  weight *pwVar5;
  ulong uVar6;
  int __c;
  sparse_parameters *in_RDX;
  long in_RSI;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> *__s;
  long in_RDI;
  float in_XMM0_Da;
  float fVar7;
  float fVar8;
  double dVar9;
  iterator iVar10;
  weight delta_weight_1;
  uint64_t i_1;
  weight delta_weight;
  uint64_t i;
  iterator w_1;
  iterator w;
  double ret;
  sparse_iterator<float> *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  float fVar11;
  undefined4 in_stack_fffffffffffffef4;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_98;
  uint32_t local_90;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_88;
  uint32_t local_80;
  sparse_iterator<float> local_78;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_68;
  uint32_t local_60;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_58;
  uint32_t local_50;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_48;
  uint32_t local_40;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_38;
  uint32_t local_30;
  double local_28;
  sparse_parameters *local_20;
  float local_14;
  long local_10;
  long local_8;
  
  local_28 = 0.0;
  local_20 = in_RDX;
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*(long *)(in_RSI + 0xd8) == 0) {
    iVar10 = sparse_parameters::begin
                       ((sparse_parameters *)
                        CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    local_48._M_cur =
         (__node_type *)
         iVar10._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_40 = iVar10._stride;
    local_38._M_cur = local_48._M_cur;
    local_30 = local_40;
    while( true ) {
      iVar10 = sparse_parameters::end
                         ((sparse_parameters *)
                          CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      local_68._M_cur =
           (__node_type *)
           iVar10._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_60 = iVar10._stride;
      local_58._M_cur = local_68._M_cur;
      local_50 = local_60;
      bVar1 = sparse_iterator<float>::operator!=
                        ((sparse_iterator<float> *)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffee8);
      fVar11 = local_14;
      if (!bVar1) break;
      pfVar3 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x245118);
      fVar7 = *pfVar3;
      pfVar3 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24512f);
      pfVar3[1] = fVar11 * fVar7 + pfVar3[1];
      dVar9 = (double)local_14;
      pfVar3 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x245179);
      fVar11 = *pfVar3;
      pfVar3 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24519e);
      local_28 = dVar9 * 0.5 * (double)fVar11 * (double)*pfVar3 + local_28;
      sparse_iterator<float>::operator++
                ((sparse_iterator<float> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
  }
  else {
    iVar10 = sparse_parameters::begin
                       ((sparse_parameters *)
                        CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    local_88._M_cur =
         (__node_type *)
         iVar10._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_80 = iVar10._stride;
    local_78._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_88._M_cur;
    local_78._stride = local_80;
    while( true ) {
      iVar10 = sparse_parameters::end
                         ((sparse_parameters *)
                          CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      local_98._M_cur =
           (__node_type *)
           iVar10._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_90 = iVar10._stride;
      __s = &local_98;
      bVar1 = sparse_iterator<float>::operator!=
                        ((sparse_iterator<float> *)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffee8);
      if (!bVar1) break;
      pcVar4 = sparse_iterator<float>::index(&local_78,(char *)__s,__c);
      uVar2 = sparse_parameters::stride_shift(local_20);
      uVar6 = (ulong)pcVar4 >> ((byte)uVar2 & 0x3f);
      pfVar3 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x2452a0);
      fVar7 = *pfVar3 - *(float *)(*(long *)(local_10 + 0xd8) + 4 + uVar6 * 8);
      fVar11 = *(float *)(*(long *)(local_10 + 0xd8) + uVar6 * 8);
      pfVar3 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x245302);
      pfVar3[1] = fVar11 * fVar7 + pfVar3[1];
      local_28 = (double)*(float *)(*(long *)(local_10 + 0xd8) + uVar6 * 8) * 0.5 * (double)fVar7 *
                 (double)fVar7 + local_28;
      sparse_iterator<float>::operator++
                ((sparse_iterator<float> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
  }
  fVar11 = local_14;
  if ((*(byte *)(local_8 + 0x330) & 1) != 0) {
    if (*(long *)(local_10 + 0xd8) == 0) {
      pwVar5 = sparse_parameters::strided_index
                         ((sparse_parameters *)
                          CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (size_t)in_stack_fffffffffffffee8);
      fVar7 = *pwVar5;
      pwVar5 = sparse_parameters::strided_index
                         ((sparse_parameters *)
                          CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (size_t)in_stack_fffffffffffffee8);
      pwVar5[1] = -fVar11 * fVar7 + pwVar5[1];
      pwVar5 = sparse_parameters::strided_index
                         ((sparse_parameters *)
                          CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (size_t)in_stack_fffffffffffffee8);
      fVar11 = *pwVar5;
      pwVar5 = sparse_parameters::strided_index
                         ((sparse_parameters *)
                          CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (size_t)in_stack_fffffffffffffee8);
      local_28 = -((double)local_14 * 0.5 * (double)fVar11) * (double)*pwVar5 + local_28;
    }
    else {
      uVar2 = sparse_parameters::stride_shift(local_20);
      uVar6 = 0xb1c55cL >> ((byte)uVar2 & 0x3f);
      pwVar5 = sparse_parameters::strided_index
                         ((sparse_parameters *)
                          CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (size_t)in_stack_fffffffffffffee8);
      fVar8 = *pwVar5 - *(float *)(*(long *)(local_10 + 0xd8) + 4 + uVar6 * 8);
      fVar11 = *(float *)(*(long *)(local_10 + 0xd8) + uVar6 * 8);
      fVar7 = fVar8;
      pwVar5 = sparse_parameters::strided_index
                         ((sparse_parameters *)CONCAT44(fVar8,fVar11),
                          (size_t)in_stack_fffffffffffffee8);
      pwVar5[1] = -fVar11 * fVar7 + pwVar5[1];
      local_28 = -((double)*(float *)(*(long *)(local_10 + 0xd8) + uVar6 * 8) * 0.5 * (double)fVar8)
                 * (double)fVar8 + local_28;
    }
  }
  return local_28;
}

Assistant:

double add_regularization(vw& all, bfgs& b, float regularization, T& weights)
{
  // compute the derivative difference
  double ret = 0.;

  if (b.regularizers == nullptr)
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_GT] += regularization * (*w);
      ret += 0.5 * regularization * (*w) * (*w);
    }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      weight delta_weight = *w - b.regularizers[2 * i + 1];
      (&(*w))[W_GT] += b.regularizers[2 * i] * delta_weight;
      ret += 0.5 * b.regularizers[2 * i] * delta_weight * delta_weight;
    }

  // if we're not regularizing the intercept term, then subtract it off from the result above
  // when accessing weights[constant], always use weights.strided_index(constant)
  if (all.no_bias)
  {
    if (b.regularizers == nullptr)
    {
      (&weights.strided_index(constant))[W_GT] -= regularization * (weights.strided_index(constant));
      ret -= 0.5 * regularization * (weights.strided_index(constant)) * (weights.strided_index(constant));
    }
    else
    {
      uint64_t i = constant >> weights.stride_shift();
      weight delta_weight = (weights.strided_index(constant)) - b.regularizers[2 * i + 1];
      (&weights.strided_index(constant))[W_GT] -= b.regularizers[2 * i] * delta_weight;
      ret -= 0.5 * b.regularizers[2 * i] * delta_weight * delta_weight;
    }
  }

  return ret;
}